

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseRefType(WastParser *this,Type *out_type)

{
  TokenType TVar1;
  Result RVar2;
  char *format;
  long lVar3;
  Type type;
  Token token;
  anon_union_24_4_98baf137_for_Token_2 local_98;
  undefined1 local_80 [32];
  size_type *local_60;
  anon_union_24_4_98baf137_for_Token_2 local_58;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  TVar1 = Peek(this,0);
  if (TVar1 == First_Type) {
    Consume((Token *)local_80,this);
    if (3 < (TokenType)local_60 - First_Type) {
      __assert_fail("HasType()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h"
                    ,0x67,"Type wabt::Token::type() const");
    }
    local_98.literal_.type = local_58.literal_.type;
    if ((local_58.literal_.type == 0xffffffef) && (this->options_[9] == (WastParseOptions)0x0)) {
      format = Type::GetName(&local_98.type_);
      Error(this,0x1b65f2,format);
      RVar2.enum_ = Error;
    }
    else {
      out_type->enum_ = (Enum)local_58.type_.enum_;
      RVar2.enum_ = Ok;
    }
  }
  else {
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"funcref","");
    local_60 = &local_58.text_.size_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"externref","");
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"exnref","");
    local_98.text_.data_ = (char *)0x0;
    local_98.text_.size_ = 0;
    local_98.literal_.text.size_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (string *)local_80,&stack0xffffffffffffffe0);
    lVar3 = 0;
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_98.text_,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98.text_);
    do {
      if (local_30 + lVar3 != *(undefined1 **)((long)local_40 + lVar3)) {
        operator_delete(*(undefined1 **)((long)local_40 + lVar3));
      }
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x60);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseRefType(Type* out_type) {
  WABT_TRACE(ParseRefType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"funcref", "externref", "exnref"});
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}